

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write-cmake.cpp
# Opt level: O1

bool CMakeWriter::write_app_resource_paths<chibi::StringBuilder>
               (ChibiInfo *chibi_info,StringBuilder *sb,ChibiLibrary *app,
               vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>
               *library_dependencies)

{
  pointer pCVar1;
  StringBuilder *pSVar2;
  int iVar3;
  ChibiLibrary *pCVar4;
  vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_> *pvVar5;
  _Alloc_hider numBytes;
  ChibiLibraryDependency *library_dependency;
  pointer pCVar6;
  StringBuilder resource_paths;
  string resource_paths_base64;
  undefined1 local_88 [32];
  ChibiLibrary *local_68;
  StringBuilder *local_60;
  string local_58;
  vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_> *local_38;
  
  pvVar5 = library_dependencies;
  local_60 = sb;
  chibi::StringBuilder::StringBuilder((StringBuilder *)local_88);
  std::__cxx11::string::append(local_88);
  if ((app->resource_path)._M_string_length != 0) {
    pvVar5 = (vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_> *)
             (app->name)._M_dataplus._M_p;
    chibi::StringBuilder::AppendFormat
              ((StringBuilder *)local_88,"%s,%s,%s\n","app",pvVar5,
               (app->resource_path)._M_dataplus._M_p);
  }
  pCVar1 = (library_dependencies->
           super__Vector_base<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  local_68 = app;
  local_38 = library_dependencies;
  for (pCVar6 = (library_dependencies->
                super__Vector_base<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>)
                ._M_impl.super__Vector_impl_data._M_start; pCVar6 != pCVar1; pCVar6 = pCVar6 + 1) {
    if ((pCVar6->type == kType_Generated) &&
       (pCVar4 = ChibiInfo::find_library(chibi_info,(pCVar6->name)._M_dataplus._M_p),
       (pCVar4->resource_path)._M_string_length != 0)) {
      pvVar5 = (vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_> *)
               (pCVar4->name)._M_dataplus._M_p;
      chibi::StringBuilder::AppendFormat
                ((StringBuilder *)local_88,"%s,%s,%s\n","library",pvVar5,
                 (pCVar4->resource_path)._M_dataplus._M_p);
    }
  }
  chibi::base64_encode_abi_cxx11_
            (&local_58,(chibi *)local_88._0_8_,(void *)local_88._8_8_,(size_t)pvVar5);
  pSVar2 = local_60;
  numBytes = dont_makearchive_conditional_begin_abi_cxx11_._M_dataplus;
  chibi::StringBuilder::AppendFormat
            (local_60,"target_compile_definitions(%s PRIVATE %sCHIBI_RESOURCE_PATHS=\"%s\"%s)\n",
             (local_68->name)._M_dataplus._M_p,
             dont_makearchive_conditional_begin_abi_cxx11_._M_dataplus._M_p,
             local_58._M_dataplus._M_p,dont_makearchive_conditional_end_abi_cxx11_._M_dataplus._M_p)
  ;
  std::__cxx11::string::append((char *)pSVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  pvVar5 = local_38;
  if ((chibi *)local_88._0_8_ != (chibi *)(local_88 + 0x10)) {
    operator_delete((void *)local_88._0_8_);
  }
  chibi::StringBuilder::StringBuilder((StringBuilder *)local_88);
  std::__cxx11::string::append(local_88);
  pCVar1 = (pvVar5->
           super__Vector_base<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pCVar6 = (pvVar5->
                super__Vector_base<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>)
                ._M_impl.super__Vector_impl_data._M_start; pCVar6 != pCVar1; pCVar6 = pCVar6 + 1) {
    if ((pCVar6->type == kType_Generated) &&
       (pCVar4 = ChibiInfo::find_library(chibi_info,(pCVar6->name)._M_dataplus._M_p),
       (pCVar4->resource_path)._M_string_length != 0)) {
      numBytes._M_p = (pCVar4->name)._M_dataplus._M_p;
      chibi::StringBuilder::AppendFormat
                ((StringBuilder *)local_88,"%s,%s,libs/%s\n","library",numBytes._M_p,numBytes._M_p);
    }
  }
  iVar3 = std::__cxx11::string::compare((char *)&s_platform_abi_cxx11_);
  pCVar4 = local_68;
  if (iVar3 == 0) {
    numBytes._M_p = (local_68->name)._M_dataplus._M_p;
    chibi::StringBuilder::AppendFormat
              ((StringBuilder *)local_88,"%s,%s,%s\n","app",numBytes._M_p,"data");
  }
  chibi::base64_encode_abi_cxx11_
            (&local_58,(chibi *)local_88._0_8_,(void *)local_88._8_8_,(size_t)numBytes._M_p);
  pSVar2 = local_60;
  chibi::StringBuilder::AppendFormat
            (local_60,"target_compile_definitions(%s PRIVATE %sCHIBI_RESOURCE_PATHS=\"%s\"%s)\n",
             (pCVar4->name)._M_dataplus._M_p,
             makearchive_conditional_begin_abi_cxx11_._M_dataplus._M_p,local_58._M_dataplus._M_p,
             makearchive_conditional_end_abi_cxx11_._M_dataplus._M_p);
  std::__cxx11::string::append((char *)pSVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((chibi *)local_88._0_8_ != (chibi *)(local_88 + 0x10)) {
    operator_delete((void *)local_88._0_8_);
  }
  return true;
}

Assistant:

static bool write_app_resource_paths(
		const ChibiInfo & chibi_info,
		S & sb,
		const ChibiLibrary & app,
		const std::vector<ChibiLibraryDependency> & library_dependencies)
	{
		// write a formatted list of all resource paths to CHIBI_RESOURCE_PATHS

		{
			// for debug/release builds : write the absolute paths to the app/library locations
			// this will allow for real-time editing to work, directly from the original source
			// locations
			
			StringBuilder resource_paths;

			resource_paths.Append("type,name,path\n");

			if (app.resource_path.empty() == false)
			{
				resource_paths.AppendFormat("%s,%s,%s\n",
					"app",
					app.name.c_str(),
					app.resource_path.c_str());
			}

			for (auto & library_dependency : library_dependencies)
			{
				if (library_dependency.type == ChibiLibraryDependency::kType_Generated)
				{
					auto * library = chibi_info.find_library(library_dependency.name.c_str());
					
					if (library->resource_path.empty() == false)
					{
						resource_paths.AppendFormat("%s,%s,%s\n",
							"library",
							library->name.c_str(),
							library->resource_path.c_str());
					}
				}
			}

			const std::string resource_paths_base64 = base64_encode(
				resource_paths.text.c_str(),
				resource_paths.text.size());

			sb.AppendFormat("target_compile_definitions(%s PRIVATE %sCHIBI_RESOURCE_PATHS=\"%s\"%s)\n",
				app.name.c_str(),
				dont_makearchive_conditional_begin.c_str(),
				resource_paths_base64.c_str(),
				dont_makearchive_conditional_end.c_str());
			sb.Append("\n");
		}
		
		{
			// for distribution builds : write the relative paths to the app/library locations
			// inside the app bundle or package location. this will allow for distributing the
			// app with all files located within the same directory structure
			
			StringBuilder resource_paths;

			resource_paths.Append("type,name,path\n");

			for (auto & library_dependency : library_dependencies)
			{
				if (library_dependency.type == ChibiLibraryDependency::kType_Generated)
				{
					auto * library = chibi_info.find_library(library_dependency.name.c_str());
					
					if (library->resource_path.empty() == false)
					{
						resource_paths.AppendFormat("%s,%s,libs/%s\n",
							"library",
							library->name.c_str(),
							library->name.c_str());
					}
				}
			}

			if (s_platform == "windows")
			{
				resource_paths.AppendFormat("%s,%s,%s\n",
					"app",
					app.name.c_str(),
					"data");
			}

			const std::string resource_paths_base64 = base64_encode(
				resource_paths.text.c_str(),
				resource_paths.text.size());

			sb.AppendFormat("target_compile_definitions(%s PRIVATE %sCHIBI_RESOURCE_PATHS=\"%s\"%s)\n",
				app.name.c_str(),
				makearchive_conditional_begin.c_str(),
				resource_paths_base64.c_str(),
				makearchive_conditional_end.c_str());
			sb.Append("\n");
		}
		
		return true;
	}